

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

bool __thiscall
vkt::api::anon_unknown_0::CompareEachPixelInEachRegion::forEach
          (CompareEachPixelInEachRegion *this,void *pUserData,
          vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          *regions,int sourceWidth,int sourceHeight,PixelBufferAccess *errorMask)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint y;
  undefined4 uVar3;
  bool bVar4;
  ulong uVar5;
  uint x;
  VkImageBlit *blit;
  pointer pCVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  Vec4 local_48;
  
  pCVar6 = (regions->
           super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  auVar9._0_4_ = (float)sourceWidth;
  auVar9._4_4_ = (float)sourceHeight;
  auVar9._8_8_ = 0;
  divps(_DAT_0093d9c0,auVar9);
  bVar4 = true;
  for (; pCVar6 != (regions->
                   super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                   )._M_impl.super__Vector_impl_data._M_finish; pCVar6 = pCVar6 + 1) {
    uVar5._0_4_ = ((VkOffset3D *)((long)pCVar6 + 0x38))[1].x;
    uVar5._4_4_ = ((VkOffset3D *)((long)pCVar6 + 0x38))[1].y;
    uVar1 = ((VkExtent3D *)((long)pCVar6 + 0x38))->width;
    y = ((VkExtent3D *)((long)pCVar6 + 0x38))->height;
    iVar10 = (undefined4)uVar5 - uVar1;
    iVar12 = uVar5._4_4_ - y;
    iVar8 = iVar10 >> 0x1f;
    if (0 < iVar10) {
      iVar8 = 1;
    }
    iVar7 = iVar12 >> 0x1f;
    if (0 < iVar12) {
      iVar7 = 1;
    }
    uVar2 = ((VkImageSubresourceLayers *)((long)pCVar6 + 0x1c))->aspectMask;
    uVar3 = ((VkImageSubresourceLayers *)((long)pCVar6 + 0x1c))->mipLevel;
    auVar13._0_4_ = (float)(uVar2 - (int)(pCVar6->bufferCopy).size);
    auVar13._4_4_ = (float)(uVar3 - (int)((pCVar6->bufferCopy).size >> 0x20));
    auVar13._8_8_ = 0;
    auVar11._0_4_ = (float)iVar10;
    auVar11._4_4_ = (float)iVar12;
    auVar11._8_8_ = 0;
    divps(auVar13,auVar11);
    iVar10 = uVar5._4_4_;
    for (; (int)y < iVar10; y = y + iVar7) {
      for (x = (pCVar6->imageBlit).dstOffsets[0].x; (int)x < (int)uVar5; x = x + iVar8) {
        iVar10 = (*this->_vptr_CompareEachPixelInEachRegion[2])(this,pUserData,(ulong)x,(ulong)y);
        if ((char)iVar10 == '\0') {
          local_48.m_data[0] = 1.0;
          local_48.m_data[1] = 0.0;
          local_48.m_data[2] = 0.0;
          local_48.m_data[3] = 1.0;
          bVar4 = false;
          tcu::PixelBufferAccess::setPixel(errorMask,&local_48,x,y,0);
        }
        uVar5 = (ulong)(uint)(pCVar6->imageBlit).dstOffsets[1].x;
      }
      iVar10 = (pCVar6->imageBlit).dstOffsets[1].y;
    }
  }
  return bVar4;
}

Assistant:

bool forEach (const void*						pUserData,
				  const std::vector<CopyRegion>&	regions,
				  const int							sourceWidth,
				  const int							sourceHeight,
				  const tcu::PixelBufferAccess&		errorMask) const
	{
		bool compareOk = true;

		for (std::vector<CopyRegion>::const_iterator regionIter = regions.begin(); regionIter != regions.end(); ++regionIter)
		{
			const VkImageBlit& blit = regionIter->imageBlit;

			const int	dx		= deSign32(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const int	dy		= deSign32(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float	xScale	= static_cast<float>(blit.srcOffsets[1].x - blit.srcOffsets[0].x) / static_cast<float>(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const float	yScale	= static_cast<float>(blit.srcOffsets[1].y - blit.srcOffsets[0].y) / static_cast<float>(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float srcInvW	= 1.0f / static_cast<float>(sourceWidth);
			const float srcInvH	= 1.0f / static_cast<float>(sourceHeight);

			for (int y = blit.dstOffsets[0].y; y < blit.dstOffsets[1].y; y += dy)
			for (int x = blit.dstOffsets[0].x; x < blit.dstOffsets[1].x; x += dx)
			{
				const tcu::Vec2 srcNormCoord
				(
					(xScale * (static_cast<float>(x - blit.dstOffsets[0].x) + 0.5f) + static_cast<float>(blit.srcOffsets[0].x)) * srcInvW,
					(yScale * (static_cast<float>(y - blit.dstOffsets[0].y) + 0.5f) + static_cast<float>(blit.srcOffsets[0].y)) * srcInvH
				);

				if (!compare(pUserData, x, y, srcNormCoord))
				{
					errorMask.setPixel(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y);
					compareOk = false;
				}
			}
		}
		return compareOk;
	}